

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

int register_ind_in_table
              (opc_handler_t_conflict **table,uchar idx1,uchar idx2,opc_handler_t_conflict *handler)

{
  int iVar1;
  opc_handler_t_conflict **table_00;
  opc_handler_t_conflict *handler_local;
  uchar idx2_local;
  uchar idx1_local;
  opc_handler_t_conflict **table_local;
  
  if (table[idx1] == &invalid_handler) {
    iVar1 = create_new_table(table,idx1);
    if (iVar1 < 0) {
      printf("*** ERROR: unable to create indirect table idx=%02x\n",(ulong)idx1);
      return -1;
    }
  }
  else {
    iVar1 = is_indirect_opcode(table[idx1]);
    if (iVar1 == 0) {
      printf("*** ERROR: idx %02x already assigned to a direct opcode\n",(ulong)idx1);
      return -1;
    }
  }
  if (handler != (opc_handler_t_conflict *)0x0) {
    table_00 = ind_table(table[idx1]);
    iVar1 = insert_in_table(table_00,idx2,handler);
    if (iVar1 < 0) {
      printf("*** ERROR: opcode %02x already assigned in opcode table %02x\n",(ulong)idx2,
             (ulong)idx1);
      return -1;
    }
  }
  return 0;
}

Assistant:

static int register_ind_in_table(opc_handler_t **table,
                                 unsigned char idx1, unsigned char idx2,
                                 opc_handler_t *handler)
{
    if (table[idx1] == &invalid_handler) {
        if (create_new_table(table, idx1) < 0) {
            printf("*** ERROR: unable to create indirect table "
                   "idx=%02x\n", idx1);
            return -1;
        }
    } else {
        if (!is_indirect_opcode(table[idx1])) {
            printf("*** ERROR: idx %02x already assigned to a direct "
                   "opcode\n", idx1);
#if defined(DO_PPC_STATISTICS) || defined(PPC_DUMP_CPU)
            printf("           Registered handler '%s' - new handler '%s'\n",
                   ind_table(table[idx1])[idx2]->oname, handler->oname);
#endif
            return -1;
        }
    }
    if (handler != NULL &&
        insert_in_table(ind_table(table[idx1]), idx2, handler) < 0) {
        printf("*** ERROR: opcode %02x already assigned in "
               "opcode table %02x\n", idx2, idx1);
#if defined(DO_PPC_STATISTICS) || defined(PPC_DUMP_CPU)
        printf("           Registered handler '%s' - new handler '%s'\n",
               ind_table(table[idx1])[idx2]->oname, handler->oname);
#endif
        return -1;
    }

    return 0;
}